

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O0

int tpm_socket_send(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  uint32_t bytes_len_local;
  uchar *tpm_bytes_local;
  TPM_SOCKET_HANDLE handle_local;
  
  if (((handle == (TPM_SOCKET_HANDLE)0x0) || (tpm_bytes == (uchar *)0x0)) || (bytes_len == 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_send",0x123,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,bytes_len);
    }
    l._0_4_ = 0x124;
  }
  else {
    l._0_4_ = send_socket_bytes(handle,tpm_bytes,(ulong)bytes_len);
  }
  return (int)l;
}

Assistant:

int tpm_socket_send(TPM_SOCKET_HANDLE handle, const unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        result = send_socket_bytes(handle, tpm_bytes, bytes_len);
    }
    return result;
}